

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O3

void ctl_refresh(tsdn_t *tsdn)

{
  background_thread_stats_t *stats;
  ctl_arena_t *ctl_sdarena;
  ctl_arena_stats_t *pcVar1;
  arena_t *arena;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ctl_arenas_t *pcVar9;
  ctl_stats_t *pcVar10;
  _Bool _Var11;
  int iVar12;
  ulong uVar13;
  ctl_arena_t *pcVar14;
  void *pvVar15;
  mutex_prof_data_t *data;
  size_t i;
  char *in_FS_OFFSET;
  long alStack_40 [2];
  
  if (*in_FS_OFFSET != '\0') {
    alStack_40[0] = 0x11c15e;
    tsd_fetch_slow(*(tsd_t **)in_FS_OFFSET,false);
  }
  pcVar9 = ctl_arenas;
  ctl_sdarena = ctl_arenas->arenas[0];
  lVar2 = -((ulong)ctl_arenas->narenas * 8 + 0xf & 0xfffffffffffffff0);
  ctl_sdarena->nthreads = 0;
  ctl_sdarena->dss = dss_prec_names[3];
  *(undefined4 *)&ctl_sdarena->dirty_decay_ms = 0xffffffff;
  *(undefined4 *)((long)&ctl_sdarena->dirty_decay_ms + 4) = 0xffffffff;
  *(undefined4 *)&ctl_sdarena->muzzy_decay_ms = 0xffffffff;
  *(undefined4 *)((long)&ctl_sdarena->muzzy_decay_ms + 4) = 0xffffffff;
  ctl_sdarena->pactive = 0;
  ctl_sdarena->pdirty = 0;
  ctl_sdarena->pmuzzy = 0;
  pcVar1 = ctl_sdarena->astats;
  *(undefined8 *)((long)alStack_40 + lVar2) = 0x11bf35;
  memset(pcVar1,0,0x27a8);
  pcVar1 = ctl_sdarena->astats;
  *(undefined8 *)((long)alStack_40 + lVar2) = 0x11bf48;
  memset(&pcVar1->allocated_small,0,0x1470);
  pcVar1 = ctl_sdarena->astats;
  *(undefined8 *)((long)alStack_40 + lVar2) = 0x11bf5d;
  memset(pcVar1->lstats,0,0x24c0);
  pcVar1 = ctl_sdarena->astats;
  *(undefined8 *)((long)alStack_40 + lVar2) = 0x11bf72;
  memset(pcVar1->estats,0,0x2550);
  if (pcVar9->narenas != 0) {
    uVar13 = 0;
    do {
      pvVar15 = arenas[uVar13].repr;
      if (pvVar15 == (void *)0x0) {
        pvVar15 = (void *)0x0;
      }
      *(void **)((long)alStack_40 + uVar13 * 8 + lVar2 + -0x38 + 0x40) = pvVar15;
      uVar13 = uVar13 + 1;
    } while (uVar13 < ctl_arenas->narenas);
    if (ctl_arenas->narenas != 0) {
      i = 0;
      do {
        *(undefined8 *)((long)alStack_40 + lVar2) = 0x11bfb6;
        pcVar14 = arenas_i(i);
        arena = *(arena_t **)((long)alStack_40 + i * 8 + lVar2 + -0x38 + 0x40);
        pcVar14->initialized = arena != (arena_t *)0x0;
        if (arena != (arena_t *)0x0) {
          *(undefined8 *)((long)alStack_40 + lVar2) = 0x11bfd4;
          ctl_arena_refresh(tsdn,arena,ctl_sdarena,(uint)i,false);
        }
        i = i + 1;
      } while (i < ctl_arenas->narenas);
    }
  }
  pcVar10 = ctl_stats;
  pcVar1 = ctl_sdarena->astats;
  ctl_stats->allocated = (pcVar1->astats).allocated_large.repr + pcVar1->allocated_small;
  pcVar10->active = ctl_sdarena->pactive << 0xc;
  pcVar10->metadata = (pcVar1->astats).internal.repr + (pcVar1->astats).base.repr;
  pcVar10->metadata_thp = (pcVar1->astats).metadata_thp.repr;
  pcVar10->resident = (pcVar1->astats).resident.repr;
  pcVar10->mapped = (pcVar1->astats).mapped.repr;
  pcVar10->retained = (pcVar1->astats).retained.repr;
  stats = &pcVar10->background_thread;
  *(undefined8 *)((long)alStack_40 + lVar2) = 0x11c048;
  _Var11 = background_thread_stats_read(tsdn,stats);
  if (_Var11) {
    stats->num_threads = 0;
    stats->num_runs = 0;
    (pcVar10->background_thread).run_interval.ns = 0;
    *(undefined8 *)((long)alStack_40 + lVar2) = 0x11c06b;
    nstime_init(&(pcVar10->background_thread).run_interval,0);
  }
  *(undefined8 *)((long)alStack_40 + lVar2) = 0x11c07e;
  iVar12 = pthread_mutex_trylock((pthread_mutex_t *)((long)&background_thread_lock.field_0 + 0x40));
  if (iVar12 != 0) {
    *(undefined8 *)((long)alStack_40 + lVar2) = 0x11c08a;
    malloc_mutex_lock_slow(&background_thread_lock);
  }
  pcVar10 = ctl_stats;
  uVar7 = background_thread_lock.field_0.witness.link.qre_next;
  uVar6 = background_thread_lock.field_0.field_0.prof_data.n_spin_acquired;
  uVar5 = background_thread_lock.field_0.field_0.prof_data.n_wait_times;
  uVar4 = background_thread_lock.field_0.field_0.prof_data.max_wait_time.ns;
  uVar3 = background_thread_lock.field_0.field_0.prof_data.tot_wait_time.ns;
  background_thread_lock.field_0.field_0.prof_data.n_lock_ops =
       background_thread_lock.field_0.field_0.prof_data.n_lock_ops + 1;
  if (background_thread_lock.field_0.field_0.prof_data.prev_owner != tsdn) {
    background_thread_lock.field_0.witness.link.qre_prev =
         (witness_t *)(background_thread_lock.field_0.field_0.prof_data.n_owner_switches + 1);
    background_thread_lock.field_0.field_0.prof_data.prev_owner = tsdn;
  }
  uVar8 = background_thread_lock.field_0.field_0.prof_data.n_owner_switches;
  ctl_stats->mutex_prof_data[0].prev_owner =
       background_thread_lock.field_0.field_0.prof_data.prev_owner;
  pcVar10->mutex_prof_data[0].n_lock_ops =
       background_thread_lock.field_0.field_0.prof_data.n_lock_ops;
  *(undefined8 *)&pcVar10->mutex_prof_data[0].max_n_thds = uVar7;
  pcVar10->mutex_prof_data[0].n_owner_switches = uVar8;
  pcVar10->mutex_prof_data[0].n_wait_times = uVar5;
  pcVar10->mutex_prof_data[0].n_spin_acquired = uVar6;
  pcVar10->mutex_prof_data[0].tot_wait_time.ns = uVar3;
  pcVar10->mutex_prof_data[0].max_wait_time.ns = uVar4;
  pcVar10->mutex_prof_data[0].n_waiting_thds.repr = 0;
  background_thread_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
  *(undefined8 *)((long)alStack_40 + lVar2) = 0x11c0ec;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&background_thread_lock.field_0 + 0x40));
  pcVar10 = ctl_stats;
  uVar3 = ctl_mtx.field_0.field_0.prof_data.max_wait_time.ns;
  ctl_stats->mutex_prof_data[1].tot_wait_time.ns =
       (uint64_t)ctl_mtx.field_0.field_0.prof_data.tot_wait_time.ns;
  pcVar10->mutex_prof_data[1].max_wait_time.ns = uVar3;
  uVar3 = ctl_mtx.field_0.field_0.prof_data.n_spin_acquired;
  pcVar10->mutex_prof_data[1].n_wait_times = ctl_mtx.field_0.field_0.prof_data.n_wait_times;
  pcVar10->mutex_prof_data[1].n_spin_acquired = uVar3;
  uVar3 = ctl_mtx.field_0.field_0.prof_data.n_owner_switches;
  *(witness_t **)&pcVar10->mutex_prof_data[1].max_n_thds = ctl_mtx.field_0.witness.link.qre_next;
  pcVar10->mutex_prof_data[1].n_owner_switches = uVar3;
  uVar3 = ctl_mtx.field_0.field_0.prof_data.n_lock_ops;
  pcVar10->mutex_prof_data[1].prev_owner = ctl_mtx.field_0.field_0.prof_data.prev_owner;
  pcVar10->mutex_prof_data[1].n_lock_ops = uVar3;
  pcVar10->mutex_prof_data[1].n_waiting_thds.repr = 0;
  ctl_arenas->epoch = ctl_arenas->epoch + 1;
  return;
}

Assistant:

static void
ctl_refresh(tsdn_t *tsdn) {
	unsigned i;
	ctl_arena_t *ctl_sarena = arenas_i(MALLCTL_ARENAS_ALL);
	VARIABLE_ARRAY(arena_t *, tarenas, ctl_arenas->narenas);

	/*
	 * Clear sum stats, since they will be merged into by
	 * ctl_arena_refresh().
	 */
	ctl_arena_clear(ctl_sarena);

	for (i = 0; i < ctl_arenas->narenas; i++) {
		tarenas[i] = arena_get(tsdn, i, false);
	}

	for (i = 0; i < ctl_arenas->narenas; i++) {
		ctl_arena_t *ctl_arena = arenas_i(i);
		bool initialized = (tarenas[i] != NULL);

		ctl_arena->initialized = initialized;
		if (initialized) {
			ctl_arena_refresh(tsdn, tarenas[i], ctl_sarena, i,
			    false);
		}
	}

	if (config_stats) {
		ctl_stats->allocated = ctl_sarena->astats->allocated_small +
		    atomic_load_zu(&ctl_sarena->astats->astats.allocated_large,
			ATOMIC_RELAXED);
		ctl_stats->active = (ctl_sarena->pactive << LG_PAGE);
		ctl_stats->metadata = atomic_load_zu(
		    &ctl_sarena->astats->astats.base, ATOMIC_RELAXED) +
		    atomic_load_zu(&ctl_sarena->astats->astats.internal,
			ATOMIC_RELAXED);
		ctl_stats->metadata_thp = atomic_load_zu(
		    &ctl_sarena->astats->astats.metadata_thp, ATOMIC_RELAXED);
		ctl_stats->resident = atomic_load_zu(
		    &ctl_sarena->astats->astats.resident, ATOMIC_RELAXED);
		ctl_stats->mapped = atomic_load_zu(
		    &ctl_sarena->astats->astats.mapped, ATOMIC_RELAXED);
		ctl_stats->retained = atomic_load_zu(
		    &ctl_sarena->astats->astats.retained, ATOMIC_RELAXED);

		ctl_background_thread_stats_read(tsdn);

#define READ_GLOBAL_MUTEX_PROF_DATA(i, mtx)				\
    malloc_mutex_lock(tsdn, &mtx);					\
    malloc_mutex_prof_read(tsdn, &ctl_stats->mutex_prof_data[i], &mtx);	\
    malloc_mutex_unlock(tsdn, &mtx);

		if (config_prof && opt_prof) {
			READ_GLOBAL_MUTEX_PROF_DATA(global_prof_mutex_prof,
			    bt2gctx_mtx);
		}
		if (have_background_thread) {
			READ_GLOBAL_MUTEX_PROF_DATA(
			    global_prof_mutex_background_thread,
			    background_thread_lock);
		} else {
			memset(&ctl_stats->mutex_prof_data[
			    global_prof_mutex_background_thread], 0,
			    sizeof(mutex_prof_data_t));
		}
		/* We own ctl mutex already. */
		malloc_mutex_prof_read(tsdn,
		    &ctl_stats->mutex_prof_data[global_prof_mutex_ctl],
		    &ctl_mtx);
#undef READ_GLOBAL_MUTEX_PROF_DATA
	}
	ctl_arenas->epoch++;
}